

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Obj_t * Abc_NtkFromMappedGia_rec(Abc_Ntk_t *pNtkNew,Gia_Man_t *p,int iObj,int fAddInv)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  Gia_Obj_t *pObj;
  Abc_Obj_t *pObjNew;
  int fAddInv_local;
  int iObj_local;
  Gia_Man_t *p_local;
  Abc_Ntk_t *pNtkNew_local;
  
  pObj_00 = Gia_ManObj(p,iObj);
  iVar1 = Gia_ObjValue(pObj_00);
  if (iVar1 < 0) {
    iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
    Abc_NtkFromMappedGia_rec(pNtkNew,p,iVar1,0);
    iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
    Abc_NtkFromMappedGia_rec(pNtkNew,p,iVar1,0);
    pObj = (Gia_Obj_t *)Abc_NtkCreateNode(pNtkNew);
    pGVar3 = Gia_ObjFanin0(pObj_00);
    iVar1 = Gia_ObjValue(pGVar3);
    pAVar4 = Abc_NtkObj(pNtkNew,iVar1);
    Abc_ObjAddFanin((Abc_Obj_t *)pObj,pAVar4);
    pGVar3 = Gia_ObjFanin1(pObj_00);
    iVar1 = Gia_ObjValue(pGVar3);
    pAVar4 = Abc_NtkObj(pNtkNew,iVar1);
    Abc_ObjAddFanin((Abc_Obj_t *)pObj,pAVar4);
    pcVar5 = Abc_SopCreateAnd((Mem_Flex_t *)pNtkNew->pManFunc,2,(int *)0x0);
    (((Abc_Obj_t *)pObj)->field_5).pData = pcVar5;
    iVar1 = Gia_ObjFaninC0(pObj_00);
    if (iVar1 != 0) {
      Abc_SopComplementVar((char *)(((Abc_Obj_t *)pObj)->field_5).pData,0);
    }
    iVar1 = Gia_ObjFaninC1(pObj_00);
    if (iVar1 != 0) {
      Abc_SopComplementVar((char *)(((Abc_Obj_t *)pObj)->field_5).pData,1);
    }
    uVar2 = Abc_ObjId((Abc_Obj_t *)pObj);
    pObj_00->Value = uVar2;
  }
  else {
    iVar1 = Gia_ObjValue(pObj_00);
    pObj = (Gia_Obj_t *)Abc_NtkObj(pNtkNew,iVar1);
  }
  if (fAddInv != 0) {
    pObj = (Gia_Obj_t *)Abc_NtkCreateNodeInv(pNtkNew,(Abc_Obj_t *)pObj);
  }
  return (Abc_Obj_t *)pObj;
}

Assistant:

Abc_Obj_t * Abc_NtkFromMappedGia_rec( Abc_Ntk_t * pNtkNew, Gia_Man_t * p, int iObj, int fAddInv )
{
    Abc_Obj_t * pObjNew;
    Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
    if ( Gia_ObjValue(pObj) >= 0 )
        pObjNew = Abc_NtkObj( pNtkNew, Gia_ObjValue(pObj) );
    else
    {
        Abc_NtkFromMappedGia_rec( pNtkNew, p, Gia_ObjFaninId0(pObj, iObj), 0 );
        Abc_NtkFromMappedGia_rec( pNtkNew, p, Gia_ObjFaninId1(pObj, iObj), 0 );
        pObjNew = Abc_NtkCreateNode( pNtkNew );
        Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj))) );
        Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin1(pObj))) );
        pObjNew->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtkNew->pManFunc, 2, NULL );
        if ( Gia_ObjFaninC0(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 0 );
        if ( Gia_ObjFaninC1(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 1 );
        pObj->Value = Abc_ObjId( pObjNew );
    }
    if ( fAddInv )
        pObjNew = Abc_NtkCreateNodeInv(pNtkNew, pObjNew);
    return pObjNew;
}